

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_crypto_tests.cpp
# Opt level: O1

void wallet::wallet_crypto_tests::TestCrypter::TestPassphraseSingle
               (span<const_unsigned_char,_18446744073709551615UL> salt,SecureString *passphrase,
               uint32_t rounds,span<const_unsigned_char,_18446744073709551615UL> correct_key,
               span<const_unsigned_char,_18446744073709551615UL> correct_iv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_type *psVar4;
  int iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  undefined8 uVar7;
  iterator pvVar8;
  __extent_storage<18446744073709551615UL> _Var9;
  iterator pvVar10;
  long in_FS_OFFSET;
  const_string file;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  const_string file_00;
  Span<const_unsigned_char> s_01;
  const_string msg;
  const_string msg_00;
  CCrypter crypt;
  char *local_1a8;
  char *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  lazy_ostream local_168;
  undefined1 *local_158;
  size_type **local_150;
  assertion_result local_148;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  CCrypter local_110;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  size_type *local_58;
  size_type local_50;
  size_type local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  _Var9 = correct_key._M_extent._M_extent_value;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CCrypter::CCrypter(&local_110);
  pvVar8 = (iterator)(ulong)rounds;
  pvVar10 = (iterator)0x0;
  CCrypter::SetKeyFromPassphrase(&local_110,passphrase,salt,rounds,0);
  if ((check_type)_Var9._M_extent_value != CHECK_PRED) {
    local_120 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_crypto_tests.cpp"
    ;
    local_118 = "";
    local_130 = &boost::unit_test::basic_cstring<char_const>::null;
    local_128 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x1f;
    file.m_begin = (iterator)&local_120;
    msg.m_end = pvVar10;
    msg.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_130,msg);
    iVar5 = bcmp(local_110.vchKey.
                 super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,correct_key._M_ptr,
                 (long)local_110.vchKey.
                       super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_110.vchKey.
                       super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start);
    local_148.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(iVar5 == 0);
    local_148.m_message.px = (element_type *)0x0;
    local_148.m_message.pn.pi_ = (sp_counted_base *)0x0;
    s.m_size = (long)local_110.vchKey.
                     super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_110.vchKey.
                     super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
    s.m_data = local_110.vchKey.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
    HexStr_abi_cxx11_(&local_98,s);
    paVar2 = &local_b8.field_2;
    local_b8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8," != ","");
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      uVar7 = local_98.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_b8._M_string_length + local_98._M_string_length) {
      uVar7 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar2) {
        uVar7 = local_b8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar7 < local_b8._M_string_length + local_98._M_string_length) goto LAB_00805609;
      pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_b8,0,0,local_98._M_dataplus._M_p,local_98._M_string_length);
    }
    else {
LAB_00805609:
      pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append(&local_98,local_b8._M_dataplus._M_p,local_b8._M_string_length);
    }
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar6->_M_dataplus)._M_p;
    paVar1 = &pbVar6->field_2;
    if (paVar3 == paVar1) {
      local_78.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_78.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    }
    else {
      local_78.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_78._M_dataplus._M_p = (pointer)paVar3;
    }
    local_78._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar1;
    pbVar6->_M_string_length = 0;
    paVar1->_M_local_buf[0] = '\0';
    s_00.m_size = _Var9._M_extent_value;
    s_00.m_data = correct_key._M_ptr;
    HexStr_abi_cxx11_(&local_d8,s_00);
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      uVar7 = local_78.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_d8._M_string_length + local_78._M_string_length) {
      uVar7 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        uVar7 = local_d8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar7 < local_d8._M_string_length + local_78._M_string_length) goto LAB_008056ec;
      pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_d8,0,0,local_78._M_dataplus._M_p,local_78._M_string_length);
    }
    else {
LAB_008056ec:
      pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append(&local_78,local_d8._M_dataplus._M_p,local_d8._M_string_length);
    }
    local_58 = &local_48;
    psVar4 = (size_type *)(pbVar6->_M_dataplus)._M_p;
    paVar1 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4 == paVar1) {
      local_48 = paVar1->_M_allocated_capacity;
      uStack_40 = *(undefined4 *)((long)&pbVar6->field_2 + 8);
      uStack_3c = *(undefined4 *)((long)&pbVar6->field_2 + 0xc);
    }
    else {
      local_48 = paVar1->_M_allocated_capacity;
      local_58 = psVar4;
    }
    local_50 = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar1;
    pbVar6->_M_string_length = 0;
    paVar1->_M_local_buf[0] = '\0';
    local_168.m_empty = false;
    local_168._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013aba30;
    local_158 = boost::unit_test::lazy_ostream::inst;
    local_150 = &local_58;
    local_178 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_crypto_tests.cpp"
    ;
    local_170 = "";
    pvVar8 = (iterator)0x1;
    pvVar10 = (iterator)0x1;
    boost::test_tools::tt_detail::report_assertion
              (&local_148,&local_168,1,1,WARN,(check_type)_Var9._M_extent_value,(size_t)&local_178,
               0x1f);
    if (local_58 != &local_48) {
      operator_delete(local_58,local_48 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    boost::detail::shared_count::~shared_count(&local_148.m_message.pn);
  }
  if (correct_iv._M_extent._M_extent_value == 0) goto LAB_00805bc4;
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_crypto_tests.cpp"
  ;
  local_180 = "";
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x23;
  file_00.m_begin = (iterator)&local_188;
  msg_00.m_end = pvVar10;
  msg_00.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_198,
             msg_00);
  iVar5 = bcmp(local_110.vchIV.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,correct_iv._M_ptr,
               (long)local_110.vchIV.
                     super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_110.vchIV.
                     super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start);
  local_148.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar5 == 0);
  local_148.m_message.px = (element_type *)0x0;
  local_148.m_message.pn.pi_ = (sp_counted_base *)0x0;
  s_01.m_size = (long)local_110.vchIV.
                      super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_110.vchIV.
                      super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start;
  s_01.m_data = local_110.vchIV.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
  HexStr_abi_cxx11_(&local_98,s_01);
  paVar2 = &local_b8.field_2;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8," != ","");
  uVar7 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    uVar7 = local_98.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar7 < local_b8._M_string_length + local_98._M_string_length) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar2) {
      uVar7 = local_b8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_b8._M_string_length + local_98._M_string_length) goto LAB_0080596e;
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_b8,0,0,local_98._M_dataplus._M_p,local_98._M_string_length);
  }
  else {
LAB_0080596e:
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_98,local_b8._M_dataplus._M_p,local_b8._M_string_length);
  }
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar6->_M_dataplus)._M_p;
  paVar1 = &pbVar6->field_2;
  if (paVar3 == paVar1) {
    local_78.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_78.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
  }
  else {
    local_78.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_78._M_dataplus._M_p = (pointer)paVar3;
  }
  local_78._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar6->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  HexStr_abi_cxx11_(&local_d8,(Span<const_unsigned_char>)correct_iv);
  uVar7 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    uVar7 = local_78.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar7 < local_d8._M_string_length + local_78._M_string_length) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      uVar7 = local_d8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_d8._M_string_length + local_78._M_string_length) goto LAB_00805a50;
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_d8,0,0,local_78._M_dataplus._M_p,local_78._M_string_length);
  }
  else {
LAB_00805a50:
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_78,local_d8._M_dataplus._M_p,local_d8._M_string_length);
  }
  local_58 = &local_48;
  psVar4 = (size_type *)(pbVar6->_M_dataplus)._M_p;
  paVar1 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4 == paVar1) {
    local_48 = paVar1->_M_allocated_capacity;
    uStack_40 = *(undefined4 *)((long)&pbVar6->field_2 + 8);
    uStack_3c = *(undefined4 *)((long)&pbVar6->field_2 + 0xc);
  }
  else {
    local_48 = paVar1->_M_allocated_capacity;
    local_58 = psVar4;
  }
  local_50 = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar6->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  local_168.m_empty = false;
  local_168._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013aba30;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = &local_58;
  local_1a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_crypto_tests.cpp"
  ;
  local_1a0 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_148,&local_168,1,1,WARN,(check_type)_Var9._M_extent_value,(size_t)&local_1a8,
             0x23);
  if (local_58 != &local_48) {
    operator_delete(local_58,local_48 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  boost::detail::shared_count::~shared_count(&local_148.m_message.pn);
LAB_00805bc4:
  CCrypter::~CCrypter(&local_110);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void TestPassphraseSingle(const std::span<const unsigned char> salt, const SecureString& passphrase, uint32_t rounds,
                                 const std::span<const unsigned char> correct_key = {},
                                 const std::span<const unsigned char> correct_iv = {})
{
    CCrypter crypt;
    crypt.SetKeyFromPassphrase(passphrase, salt, rounds, 0);

    if (!correct_key.empty()) {
        BOOST_CHECK_MESSAGE(memcmp(crypt.vchKey.data(), correct_key.data(), crypt.vchKey.size()) == 0,
            HexStr(crypt.vchKey) + std::string(" != ") + HexStr(correct_key));
    }
    if (!correct_iv.empty()) {
        BOOST_CHECK_MESSAGE(memcmp(crypt.vchIV.data(), correct_iv.data(), crypt.vchIV.size()) == 0,
            HexStr(crypt.vchIV) + std::string(" != ") + HexStr(correct_iv));
    }
}